

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O2

void __thiscall
duckdb::LocalStorage::MoveStorage(LocalStorage *this,DataTable *old_dt,DataTable *new_dt)

{
  LocalTableStorage *pLVar1;
  shared_ptr<duckdb::LocalTableStorage,_true> new_storage;
  undefined1 local_38 [16];
  shared_ptr<duckdb::LocalTableStorage,_true> local_28;
  
  LocalTableManager::MoveEntry((LocalTableManager *)local_38,(DataTable *)&this->table_manager);
  if (local_38._0_8_ != 0) {
    pLVar1 = shared_ptr<duckdb::LocalTableStorage,_true>::operator->
                       ((shared_ptr<duckdb::LocalTableStorage,_true> *)local_38);
    (pLVar1->table_ref)._M_data = new_dt;
    local_28.internal.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)local_38._0_8_;
    local_28.internal.super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._8_8_;
    local_38._0_8_ = 0;
    local_38._8_8_ = 0;
    LocalTableManager::InsertEntry(&this->table_manager,new_dt,&local_28);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_28.internal.
                super___shared_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  return;
}

Assistant:

void LocalStorage::MoveStorage(DataTable &old_dt, DataTable &new_dt) {
	// check if there are any pending appends for the old version of the table
	auto new_storage = table_manager.MoveEntry(old_dt);
	if (!new_storage) {
		return;
	}
	// take over the storage from the old entry
	new_storage->table_ref = new_dt;
	table_manager.InsertEntry(new_dt, std::move(new_storage));
}